

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O3

string_t __thiscall
duckdb::FromBinaryOperator::Operation<duckdb::string_t,duckdb::string_t>
          (FromBinaryOperator *this,string_t input,Vector *result)

{
  uint8_t uVar1;
  byte *pbVar2;
  long lVar3;
  byte bVar4;
  byte *pbVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  bool bVar10;
  string_t sVar11;
  string_t target;
  undefined1 local_68 [16];
  ulong local_58;
  undefined1 local_50 [16];
  undefined8 local_40;
  long local_38;
  
  local_38 = input.value._0_8_;
  lVar3 = local_38;
  if ((uint)this < 0xd) {
    lVar3 = (long)&local_40 + 4;
  }
  local_58 = (ulong)this & 0xffffffff;
  local_40 = this;
  local_68 = (undefined1  [16])
             StringVector::EmptyString
                       (input.value._8_8_,(Vector *)(local_58 + 7 >> 3),(idx_t)input.value._8_8_);
  pbVar5 = local_68._8_8_;
  if (local_68._0_4_ < 0xd) {
    pbVar5 = local_68 + 4;
  }
  if (((ulong)this & 7) == 0) {
    uVar6 = 0;
  }
  else {
    uVar8 = (uint)this & 7;
    bVar4 = 0;
    uVar6 = 0;
    local_50 = local_68;
    do {
      uVar8 = uVar8 - 1;
      uVar1 = StringUtil::GetBinaryValue(*(char *)(lVar3 + uVar6));
      bVar4 = bVar4 | uVar1 << ((byte)uVar8 & 0x1f);
      uVar6 = uVar6 + 1;
    } while (uVar6 != ((ulong)this & 7));
    pbVar2 = (byte *)(local_50._8_8_ + 1);
    bVar10 = 0xc < (uint)local_50._0_4_;
    *pbVar5 = bVar4;
    pbVar5 = local_68 + 5;
    if (bVar10) {
      pbVar5 = pbVar2;
    }
  }
  for (; uVar6 < local_58; uVar6 = uVar6 + 8) {
    pcVar9 = (char *)(lVar3 + uVar6);
    lVar7 = 0;
    bVar4 = 0;
    do {
      uVar1 = StringUtil::GetBinaryValue(*pcVar9);
      bVar4 = bVar4 | uVar1 << ((char)lVar7 + 7U & 0x1f);
      lVar7 = lVar7 + -1;
      pcVar9 = pcVar9 + 1;
    } while (lVar7 != -8);
    *pbVar5 = bVar4;
    pbVar5 = pbVar5 + 1;
  }
  uVar6 = (ulong)(uint)local_68._0_4_;
  if (uVar6 < 0xd) {
    switchD_012e3010::default(local_68 + uVar6 + 4,0,0xc - uVar6);
  }
  else {
    local_68._4_4_ = *(undefined4 *)local_68._8_8_;
  }
  sVar11.value.pointer.ptr = (char *)local_68._8_8_;
  sVar11.value._0_8_ = local_68._0_8_;
  return (string_t)sVar11.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		if (size > NumericLimits<uint32_t>::Maximum()) {
			throw InvalidInputException("Binary input length larger than 2^32 are not supported");
		}

		D_ASSERT(size <= NumericLimits<uint32_t>::Maximum());
		auto buffer_size = (size + 7) / 8;

		// Allocate empty space
		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		// Treated as a single byte
		idx_t i = 0;
		if (size % 8 != 0) {
			uint8_t byte = 0;
			for (idx_t j = size % 8; j > 0; --j) {
				byte |= StringUtil::GetBinaryValue(data[i]) << (j - 1);
				i++;
			}
			*output = static_cast<char>(byte); // binary eh
			output++;
		}

		while (i < size) {
			uint8_t byte = 0;
			for (idx_t j = 8; j > 0; --j) {
				byte |= StringUtil::GetBinaryValue(data[i]) << (j - 1);
				i++;
			}
			*output = static_cast<char>(byte);
			output++;
		}

		target.Finalize();
		return target;
	}